

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

float GD::get_pred_per_update<true,false,true,1ul,0ul,2ul,true>(gd *g,example *ec)

{
  long in_RSI;
  long in_RDI;
  norm_data nd;
  float grad_squared;
  vw *all;
  label_data *ld;
  example *in_stack_ffffffffffffff98;
  vw *local_58;
  undefined1 local_38 [16];
  thread local_28;
  long local_20;
  
  local_20 = in_RSI + 0x6828;
  local_28._M_id._M_thread = *(id *)(in_RDI + 0x60);
  local_38._12_4_ = *(undefined4 *)(in_RSI + 0x6870);
  local_58 = (vw *)local_38;
  do {
    *(undefined4 *)&local_58->sd = 0;
    local_58 = (vw *)((long)&local_58->sd + 4);
  } while (local_58 != (vw *)(local_38 + 0xc));
  foreach_feature<GD::norm_data,_&GD::pred_per_update_feature>
            ((vw *)(local_38 + 0xc),in_stack_ffffffffffffff98,(norm_data *)0x1a3e72);
  return 0.0;
}

Assistant:

float get_pred_per_update(gd& g, example& ec)
{
  // We must traverse the features in _precisely_ the same order as during training.
  label_data& ld = ec.l.simple;
  vw& all = *g.all;

  float grad_squared = ec.weight;
  if (!adax)
    grad_squared *= all.loss->getSquareGrad(ec.pred.scalar, ld.label);

  if (grad_squared == 0 && !stateless)
    return 1.;

  norm_data nd = {grad_squared, 0., 0., {g.neg_power_t, g.neg_norm_power}, {0}};
  foreach_feature<norm_data,
      pred_per_update_feature<sqrt_rate, feature_mask_off, adaptive, normalized, spare, stateless> >(all, ec, nd);
  if (normalized)
  {
    if (!stateless)
    {
      g.all->normalized_sum_norm_x += ((double)ec.weight) * nd.norm_x;
      g.total_weight += ec.weight;
      g.update_multiplier = average_update<sqrt_rate, adaptive, normalized>(
          (float)g.total_weight, (float)g.all->normalized_sum_norm_x, g.neg_norm_power);
    }
    else
    {
      float nsnx = ((float)g.all->normalized_sum_norm_x) + ec.weight * nd.norm_x;
      float tw = (float)g.total_weight + ec.weight;
      g.update_multiplier = average_update<sqrt_rate, adaptive, normalized>(tw, nsnx, g.neg_norm_power);
    }
    nd.pred_per_update *= g.update_multiplier;
  }
  return nd.pred_per_update;
}